

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O2

void __thiscall anon_unknown.dwarf_7b5804::Helper::Helper(Helper *this,cmExecutionStatus *status)

{
  cmMakefile *this_00;
  allocator<char> local_39;
  string local_38;
  
  this->Status = status;
  this_00 = status->Makefile;
  this->Makefile = this_00;
  (this->DefaultComponentName)._M_dataplus._M_p = (pointer)&(this->DefaultComponentName).field_2;
  (this->DefaultComponentName)._M_string_length = 0;
  (this->DefaultComponentName).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CMAKE_INSTALL_DEFAULT_COMPONENT_NAME",&local_39);
  cmMakefile::GetSafeDefinition(this_00,&local_38);
  std::__cxx11::string::_M_assign((string *)&this->DefaultComponentName);
  std::__cxx11::string::~string((string *)&local_38);
  if ((this->DefaultComponentName)._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&this->DefaultComponentName);
  }
  return;
}

Assistant:

Helper(cmExecutionStatus& status)
    : Status(status)
    , Makefile(&status.GetMakefile())
  {
    this->DefaultComponentName = this->Makefile->GetSafeDefinition(
      "CMAKE_INSTALL_DEFAULT_COMPONENT_NAME");
    if (this->DefaultComponentName.empty()) {
      this->DefaultComponentName = "Unspecified";
    }
  }